

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int asl::myatoi(char *s)

{
  int iVar1;
  int local_18;
  int c;
  int sgn;
  int y;
  char *s_local;
  
  c = 0;
  local_18 = 1;
  if (*s == '-') {
    local_18 = -1;
    _sgn = s + 1;
  }
  else {
    _sgn = s;
    if (*s == '+') {
      _sgn = s + 1;
    }
  }
  while( true ) {
    iVar1 = (int)*_sgn;
    if (iVar1 < 0x30 || 0x39 < iVar1) break;
    c = c * 10 + iVar1 + -0x30;
    _sgn = _sgn + 1;
  }
  return c * local_18;
}

Assistant:

int myatoi(const char* s)
{
	int y = 0, sgn = 1;
	if (s[0] == '-') { sgn = -1; s++; }
	else if (s[0] == '+') s++;
	int c;
	while (c = *s++, c >= '0' && c <= '9')
		y = 10 * y + (c - '0');
	return y*sgn;
}